

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O3

sx__job_thread_data * sx__job_create_tdata(sx_alloc *alloc,uint32_t tid,int index,_Bool main_thrd)

{
  code *pcVar1;
  _Bool _Var2;
  sx__job_thread_data *psVar3;
  size_t sVar4;
  undefined7 in_register_00000009;
  char *fmt;
  uint32_t line;
  undefined4 in_register_00000034;
  _Bool in_R8B;
  
  psVar3 = (sx__job_thread_data *)
           (*(code *)alloc)(0,0x30,0,0,0,0,CONCAT44(in_register_00000034,tid));
  if (psVar3 == (sx__job_thread_data *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x1fa);
    fmt = "Out of memory";
    line = 0x1fa;
  }
  else {
    psVar3->thread_index = 0;
    psVar3->tid = 0;
    psVar3->tags = 0;
    psVar3->main_thrd = false;
    *(undefined3 *)&psVar3->field_0x2d = 0;
    *(undefined8 *)&(psVar3->selector_stack).ssize = 0;
    psVar3->selector_fiber = (sx_fiber_t)0x0;
    psVar3->cur_job = (sx__job *)0x0;
    (psVar3->selector_stack).sptr = (void *)0x0;
    psVar3->thread_index = (int)CONCAT71(in_register_00000009,main_thrd);
    psVar3->tid = index;
    psVar3->tags = 0xffffffff;
    psVar3->main_thrd = in_R8B;
    sVar4 = sx_os_minstacksz();
    _Var2 = sx_fiber_stack_init(&psVar3->selector_stack,(uint)sVar4);
    if (_Var2) {
      return psVar3;
    }
    fmt = "Not enough memory for temp stacks";
    line = 0x204;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",line,
                    fmt);
  pcVar1 = (code *)swi(3);
  psVar3 = (sx__job_thread_data *)(*pcVar1)();
  return psVar3;
}

Assistant:

static sx__job_thread_data* sx__job_create_tdata(const sx_alloc* alloc, uint32_t tid, int index,
                                                 bool main_thrd)
{
    sx__job_thread_data* tdata =
        (sx__job_thread_data*)sx_malloc(alloc, sizeof(sx__job_thread_data));
    if (!tdata) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(tdata, 0x0, sizeof(sx__job_thread_data));
    tdata->thread_index = index;
    tdata->tid = tid;
    tdata->tags = 0xffffffff;
    tdata->main_thrd = main_thrd;

    bool r = sx_fiber_stack_init(&tdata->selector_stack, (int)sx_os_minstacksz());
    sx_assertf(r, "Not enough memory for temp stacks");
    sx_unused(r);

    return tdata;
}